

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_SetPrototypeInternal(JSContext *ctx,JSValue obj,JSValue proto_val,BOOL throw_flag)

{
  JSShape *pJVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  uint uVar5;
  JSValueUnion p;
  char *fmt;
  uint uVar6;
  JSValueUnion JVar7;
  JSValue v;
  
  JVar4 = proto_val.u;
  p = obj.u;
  uVar5 = (uint)obj.tag;
  if (throw_flag == 0) {
    if (uVar5 == 0xffffffff) goto LAB_0011db9a;
  }
  else if ((uVar5 & 0xfffffffe) != 2) {
LAB_0011db9a:
    uVar6 = (uint)proto_val.tag;
    JVar7 = JVar4;
    if (uVar6 != 0xffffffff) {
      if (uVar6 != 2) goto LAB_0011dbb0;
      JVar7.float64 = 0.0;
    }
    if (throw_flag != 0 && uVar5 != 0xffffffff) {
      return 1;
    }
    if (*(short *)((long)p.ptr + 6) == 0x29) {
      iVar2 = js_proxy_setPrototypeOf(ctx,obj,proto_val,throw_flag);
      return iVar2;
    }
    if ((*(JSShape **)((long)p.ptr + 0x18))->proto == (JSObject *)JVar7.ptr) {
      return 1;
    }
    if ((*(byte *)((long)p.ptr + 5) & 1) != 0) {
      JVar3 = JVar7;
      if ((JSObject *)JVar7.ptr != (JSObject *)0x0) {
        do {
          if (JVar3.ptr == p.ptr) {
            if (throw_flag == 0) {
              return 0;
            }
            fmt = "circular prototype chain";
            goto LAB_0011dbb7;
          }
          JVar3 = (JSValueUnion)(*(JSShape **)((long)JVar3.ptr + 0x18))->proto;
        } while ((JSObject *)JVar3.ptr != (JSObject *)0x0);
        if (0xfffffff4 < uVar6) {
          *(int *)JVar4.ptr = *JVar4.ptr + 1;
        }
      }
      iVar2 = js_shape_prepare_update(ctx,(JSObject *)p.ptr,(JSShapeProperty **)0x0);
      if (iVar2 == 0) {
        pJVar1 = *(JSShape **)((long)p.ptr + 0x18);
        JVar4 = (JSValueUnion)pJVar1->proto;
        if ((JSObject *)JVar4.ptr != (JSObject *)0x0) {
          v.tag = -1;
          v.u.ptr = JVar4.ptr;
          JS_FreeValue(ctx,v);
        }
        pJVar1->proto = (JSObject *)JVar7;
        return 1;
      }
      return -1;
    }
    if (throw_flag == 0) {
      return 0;
    }
    fmt = "object is not extensible";
    goto LAB_0011dbb7;
  }
LAB_0011dbb0:
  fmt = "not an object";
LAB_0011dbb7:
  JS_ThrowTypeError(ctx,fmt);
  return -1;
}

Assistant:

static int JS_SetPrototypeInternal(JSContext *ctx, JSValueConst obj,
                                   JSValueConst proto_val,
                                   BOOL throw_flag)
{
    JSObject *proto, *p, *p1;
    JSShape *sh;

    if (throw_flag) {
        if (JS_VALUE_GET_TAG(obj) == JS_TAG_NULL ||
            JS_VALUE_GET_TAG(obj) == JS_TAG_UNDEFINED)
            goto not_obj;
    } else {
        if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
            goto not_obj;
    }
    p = JS_VALUE_GET_OBJ(obj);
    if (JS_VALUE_GET_TAG(proto_val) != JS_TAG_OBJECT) {
        if (JS_VALUE_GET_TAG(proto_val) != JS_TAG_NULL) {
        not_obj:
            JS_ThrowTypeErrorNotAnObject(ctx);
            return -1;
        }
        proto = NULL;
    } else {
        proto = JS_VALUE_GET_OBJ(proto_val);
    }

    if (throw_flag && JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return TRUE;

    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_setPrototypeOf(ctx, obj, proto_val, throw_flag);
    sh = p->shape;
    if (sh->proto == proto)
        return TRUE;
    if (!p->extensible) {
        if (throw_flag) {
            JS_ThrowTypeError(ctx, "object is not extensible");
            return -1;
        } else {
            return FALSE;
        }
    }
    if (proto) {
        /* check if there is a cycle */
        p1 = proto;
        do {
            if (p1 == p) {
                if (throw_flag) {
                    JS_ThrowTypeError(ctx, "circular prototype chain");
                    return -1;
                } else {
                    return FALSE;
                }
            }
            /* Note: for Proxy objects, proto is NULL */
            p1 = p1->shape->proto;
        } while (p1 != NULL);
        JS_DupValue(ctx, proto_val);
    }

    if (js_shape_prepare_update(ctx, p, NULL))
        return -1;
    sh = p->shape;
    if (sh->proto)
        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, sh->proto));
    sh->proto = proto;
    return TRUE;
}